

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_is_subset(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint16_t *puVar5;
  bool bVar6;
  byte bVar7;
  _Bool _Var8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  array_container_t *container2;
  array_container_t *container1;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ushort uVar16;
  uint uVar17;
  uint uVar18;
  
  uVar3 = (r1->high_low_container).size;
  if ((int)uVar3 < 1) {
    uVar18 = 0;
  }
  else {
    uVar4 = (r2->high_low_container).size;
    uVar9 = 0;
    uVar17 = 0;
    uVar18 = 0;
    uVar11 = 1;
    do {
      while( true ) {
        if ((int)uVar4 <= (int)uVar17) goto LAB_0011a8ce;
        uVar1 = (r1->high_low_container).keys[uVar9];
        puVar5 = (r2->high_low_container).keys;
        uVar12 = uVar17 & 0xffff;
        uVar2 = puVar5[uVar12];
        if (uVar1 == uVar2) break;
        if (uVar1 < uVar2) {
          return false;
        }
        uVar12 = uVar17 + 1;
        uVar15 = uVar12;
        if (((int)uVar12 < (int)uVar4) && (puVar5[(int)uVar12] < uVar1)) {
          uVar17 = uVar17 + 2;
          iVar14 = 1;
          if ((int)uVar17 < (int)uVar4) {
            iVar13 = 1;
            do {
              uVar16 = puVar5[(int)uVar17];
              iVar14 = iVar13;
              if (uVar1 <= uVar16) goto LAB_0011a7ab;
              iVar14 = iVar13 * 2;
              uVar17 = uVar12 + iVar13 * 2;
              iVar13 = iVar14;
            } while ((int)uVar17 < (int)uVar4);
          }
          uVar16 = puVar5[(long)(int)uVar4 + -1];
          uVar17 = uVar4 - 1;
LAB_0011a7ab:
          uVar15 = uVar17;
          if (((uVar16 != uVar1) && (uVar15 = uVar4, uVar1 <= uVar16)) &&
             (uVar15 = uVar17, (iVar14 >> 1) + uVar12 + 1 != uVar17)) {
            uVar12 = (iVar14 >> 1) + uVar12;
            do {
              uVar15 = (int)(uVar12 + uVar17) >> 1;
              if (puVar5[(int)uVar15] == uVar1) break;
              if (puVar5[(int)uVar15] < uVar1) {
                uVar12 = uVar15;
                uVar15 = uVar17;
              }
              uVar17 = uVar15;
              uVar15 = uVar17;
            } while (uVar12 + 1 != uVar17);
          }
        }
        uVar17 = uVar15;
        if (uVar1 == uVar2) {
          return false;
        }
      }
      bVar10 = (r1->high_low_container).typecodes[uVar9];
      container1 = (array_container_t *)(r1->high_low_container).containers[uVar9];
      bVar7 = (r2->high_low_container).typecodes[uVar12];
      container2 = (array_container_t *)(r2->high_low_container).containers[uVar12];
      if (bVar10 == 4) {
        bVar10 = *(byte *)&container1->array;
        if (bVar10 == 4) goto LAB_0011a8e3;
        container1 = *(array_container_t **)container1;
      }
      if (bVar7 == 4) {
        bVar7 = *(byte *)&container2->array;
        if (bVar7 == 4) {
LAB_0011a8e3:
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        container2 = *(array_container_t **)container2;
      }
      switch((uint)bVar7 + (uint)bVar10 * 4) {
      case 5:
        _Var8 = bitset_container_is_subset
                          ((bitset_container_t *)container1,(bitset_container_t *)container2);
        break;
      case 6:
        goto LAB_0011a8d4;
      case 7:
        _Var8 = bitset_container_is_subset_run
                          ((bitset_container_t *)container1,(run_container_t *)container2);
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x12d5,
                      "_Bool container_is_subset(const container_t *, uint8_t, const container_t *, uint8_t)"
                     );
      case 9:
        _Var8 = array_container_is_subset_bitset(container1,(bitset_container_t *)container2);
        break;
      case 10:
        _Var8 = array_container_is_subset(container1,container2);
        break;
      case 0xb:
        _Var8 = array_container_is_subset_run(container1,(run_container_t *)container2);
        break;
      case 0xd:
        _Var8 = run_container_is_subset_bitset
                          ((run_container_t *)container1,(bitset_container_t *)container2);
        break;
      case 0xe:
        _Var8 = run_container_is_subset_array((run_container_t *)container1,container2);
        break;
      case 0xf:
        _Var8 = run_container_is_subset((run_container_t *)container1,(run_container_t *)container2)
        ;
      }
      if (_Var8 == false) {
LAB_0011a8d4:
        return false;
      }
      uVar17 = uVar17 + 1;
      uVar9 = uVar11 & 0xffff;
      bVar6 = (int)uVar11 < (int)uVar3;
      uVar18 = uVar11;
      uVar11 = uVar11 + 1;
    } while (bVar6);
  }
LAB_0011a8ce:
  return uVar18 == uVar3;
}

Assistant:

bool roaring_bitmap_is_subset(const roaring_bitmap_t *r1,
                              const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    const int length1 = ra1->size,
              length2 = ra2->size;

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(ra1, pos1);
        const uint16_t s2 = ra_get_key_at_index(ra2, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(ra1, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(ra2, pos2, &type2);
            if (!container_is_subset(c1, type1, c2, type2))
                return false;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            return false;
        } else {  // s1 > s2
            pos2 = ra_advance_until(ra2, s1, pos2);
        }
    }
    if (pos1 == length1)
        return true;
    else
        return false;
}